

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterBlur.cpp
# Opt level: O3

SharedPtr<Filter> __thiscall
Rml::FilterBlurInstancer::InstanceFilter
          (FilterBlurInstancer *this,String *param_1,PropertyDictionary *properties)

{
  FilterBlur *pFVar1;
  Property *this_00;
  NumericValue NVar2;
  PropertyDictionary *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  SharedPtr<Filter> SVar4;
  undefined1 local_29;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = PropertyDictionary::GetProperty(in_RCX,param_1[3].field_2._M_local_buf[8]);
  if (this_00 == (Property *)0x0) {
    local_28._0_4_ = 0;
    local_28._4_4_ = 0;
    _Stack_20._M_pi._0_4_ = 0;
    _Stack_20._M_pi._4_4_ = 0;
    _Var3._M_pi = extraout_RDX;
  }
  else {
    local_28 = (FilterBlur *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::FilterBlur,std::allocator<Rml::FilterBlur>>
              (&_Stack_20,(FilterBlur **)&local_28,(allocator<Rml::FilterBlur> *)&local_29);
    pFVar1 = local_28;
    NVar2 = Property::GetNumericValue(this_00);
    pFVar1->sigma_value = NVar2;
    _Var3._M_pi = extraout_RDX_00;
    if (((ulong)NVar2 >> 0x20 & 0x3fbc0) == 0) {
      (this->super_FilterInstancer)._vptr_FilterInstancer = (_func_int **)0x0;
      (this->super_FilterInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(_Stack_20._M_pi._4_4_,_Stack_20._M_pi._0_4_) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(_Stack_20._M_pi._4_4_,_Stack_20._M_pi._0_4_));
        _Var3._M_pi = extraout_RDX_01;
      }
      goto LAB_0024348a;
    }
  }
  *(undefined4 *)&(this->super_FilterInstancer)._vptr_FilterInstancer = (undefined4)local_28;
  *(undefined4 *)((long)&(this->super_FilterInstancer)._vptr_FilterInstancer + 4) = local_28._4_4_;
  *(undefined4 *)
   &(this->super_FilterInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = _Stack_20._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(this->super_FilterInstancer).super_EffectSpecification.properties.properties.
           super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
           ._M_impl.super__Vector_impl_data + 4) = _Stack_20._M_pi._4_4_;
LAB_0024348a:
  SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (SharedPtr<Filter>)SVar4.super___shared_ptr<Rml::Filter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Filter> FilterBlurInstancer::InstanceFilter(const String& /*name*/, const PropertyDictionary& properties)
{
	const Property* p_radius = properties.GetProperty(ids.sigma);
	if (!p_radius)
		return nullptr;

	auto decorator = MakeShared<FilterBlur>();
	if (decorator->Initialise(p_radius->GetNumericValue()))
		return decorator;

	return nullptr;
}